

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

void lws_wsi_mux_dump_children(lws *wsi)

{
  int iVar1;
  char *local_20;
  lws **local_18;
  lws **w;
  lws *wsi_local;
  
  if (((wsi->mux).parent_wsi != (lws *)0x0) && (iVar1 = lwsl_visible(8), iVar1 != 0)) {
    for (local_18 = &(((wsi->mux).parent_wsi)->mux).child_list; *local_18 != (lws *)0x0;
        local_18 = &((*local_18)->mux).sibling_list) {
      if ((*local_18)->role_ops == (lws_role_ops *)0x0) {
        local_20 = "?";
      }
      else {
        local_20 = (*local_18)->role_ops->name;
      }
      _lws_log(8,"   \\---- child %s %p\n",local_20,*local_18);
      if (*local_18 == ((*local_18)->mux).sibling_list) {
        __assert_fail("*w != (*w)->mux.sibling_list",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/wsi.c"
                      ,0x450,"void lws_wsi_mux_dump_children(struct lws *)");
      }
    }
  }
  return;
}

Assistant:

void
lws_wsi_mux_dump_children(struct lws *wsi)
{
#if defined(_DEBUG)
	if (!wsi->mux.parent_wsi || !lwsl_visible(LLL_INFO))
		return;

	lws_start_foreach_llp(struct lws **, w,
			      wsi->mux.parent_wsi->mux.child_list) {
		lwsl_info("   \\---- child %s %p\n",
			  (*w)->role_ops ? (*w)->role_ops->name : "?", *w);
		assert(*w != (*w)->mux.sibling_list);
	} lws_end_foreach_llp(w, mux.sibling_list);
#endif
}